

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O0

void save_image(string *filename,vector<PixelColor,_std::allocator<PixelColor>_> *image_data)

{
  uchar uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  byte bVar4;
  bool bVar5;
  runtime_error *this;
  reference pPVar6;
  ostream *poVar7;
  uchar local_244;
  uchar uStack_243;
  PixelColor col;
  const_iterator cStack_240;
  const_iterator __end1;
  const_iterator __begin1;
  vector<PixelColor,_std::allocator<PixelColor>_> *__range1;
  ostream local_218 [8];
  ofstream out;
  vector<PixelColor,_std::allocator<PixelColor>_> *image_data_local;
  string *filename_local;
  
  std::ofstream::ofstream(local_218,(string *)filename,_S_bin);
  bVar4 = std::ofstream::is_open();
  if ((bVar4 & 1) == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"unable to open output file");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __end1 = std::vector<PixelColor,_std::allocator<PixelColor>_>::begin(image_data);
  cStack_240 = std::vector<PixelColor,_std::allocator<PixelColor>_>::end(image_data);
  while( true ) {
    bVar5 = __gnu_cxx::
            operator==<const_PixelColor_*,_std::vector<PixelColor,_std::allocator<PixelColor>_>_>
                      (&__end1,&stack0xfffffffffffffdc0);
    if (((bVar5 ^ 0xffU) & 1) == 0) break;
    pPVar6 = __gnu_cxx::
             __normal_iterator<const_PixelColor_*,_std::vector<PixelColor,_std::allocator<PixelColor>_>_>
             ::operator*(&__end1);
    uVar1 = pPVar6->b;
    uVar2 = pPVar6->r;
    uVar3 = pPVar6->g;
    poVar7 = std::operator<<(local_218,uVar2);
    poVar7 = std::operator<<(poVar7,uVar3);
    std::operator<<(poVar7,uVar1);
    __gnu_cxx::
    __normal_iterator<const_PixelColor_*,_std::vector<PixelColor,_std::allocator<PixelColor>_>_>::
    operator++(&__end1);
  }
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void save_image(const std::string& filename, const std::vector<PixelColor>& image_data)
{
    std::ofstream out{filename, std::ofstream::binary};

    if (!out.is_open())
        throw std::runtime_error("unable to open output file");

    for (auto col : image_data)
        out << col.r << col.g << col.b;
}